

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_do_cfb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  grasshopper_round_keys_t *in_RCX;
  byte *in_RDX;
  byte *in_RSI;
  undefined8 in_RDI;
  bool bVar4;
  size_t j;
  size_t i;
  int num;
  _Bool encrypting;
  uchar *iv;
  uchar *buf;
  uchar *out_ptr;
  uchar *in_ptr;
  gost_grasshopper_cipher_ctx *c;
  grasshopper_w128_t *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  grasshopper_w128_t *source;
  ulong __n;
  grasshopper_w128_t *subkeys;
  byte *local_40;
  byte *local_38;
  
  EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  lVar2 = EVP_CIPHER_CTX_buf_noconst(in_RDI);
  puVar3 = (undefined8 *)EVP_CIPHER_CTX_iv_noconst(in_RDI);
  iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
  bVar4 = iVar1 != 0;
  iVar1 = EVP_CIPHER_CTX_get_num(in_RDI);
  subkeys = (grasshopper_w128_t *)0x0;
  source = (grasshopper_w128_t *)0x0;
  local_40 = in_RSI;
  local_38 = in_RDX;
  if (0 < iVar1) {
    subkeys = (grasshopper_w128_t *)0x0;
    for (source = (grasshopper_w128_t *)(long)iVar1;
        in_stack_ffffffffffffff97 = source < (grasshopper_w128_t *)0x10 && subkeys < in_RCX,
        source < (grasshopper_w128_t *)0x10 && subkeys < in_RCX;
        source = (grasshopper_w128_t *)(source->b + 1)) {
      if (!bVar4) {
        source->b[lVar2 + 0x10] = *local_38;
      }
      *local_40 = source->b[lVar2] ^ *local_38;
      if (bVar4) {
        source->b[lVar2 + 0x10] = *local_40;
      }
      subkeys = (grasshopper_w128_t *)((long)subkeys + 1);
      local_38 = local_38 + 1;
      local_40 = local_40 + 1;
    }
    if (source != (grasshopper_w128_t *)0x10) {
      EVP_CIPHER_CTX_set_num(in_RDI,(ulong)source & 0xffffffff);
      return 1;
    }
    *puVar3 = *(undefined8 *)(lVar2 + 0x10);
    puVar3[1] = *(undefined8 *)(lVar2 + 0x18);
    EVP_CIPHER_CTX_set_num(in_RDI,0);
  }
  for (; subkeys + 1 < in_RCX; subkeys = ((grasshopper_round_keys_t *)subkeys)->k + 1) {
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)subkeys,source,
               (grasshopper_w128_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    if (!bVar4) {
      *puVar3 = *(undefined8 *)local_38;
      puVar3[1] = *(undefined8 *)(local_38 + 8);
    }
    for (source = (grasshopper_w128_t *)0x0; source < (grasshopper_w128_t *)0x10;
        source = (grasshopper_w128_t *)(source->b + 1)) {
      local_40[(long)source->b] = source->b[lVar2] ^ local_38[(long)source->b];
    }
    if (bVar4) {
      *puVar3 = *(undefined8 *)local_40;
      puVar3[1] = *(undefined8 *)(local_40 + 8);
    }
    local_38 = local_38 + 0x10;
    local_40 = local_40 + 0x10;
  }
  if (subkeys < in_RCX) {
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)subkeys,source,
               (grasshopper_w128_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    if (!bVar4) {
      memcpy((void *)(lVar2 + 0x10),local_38,(long)in_RCX - (long)subkeys);
    }
    __n = 0;
    for (; subkeys < in_RCX;
        subkeys = (grasshopper_w128_t *)((long)((grasshopper_round_keys_t *)subkeys)->k + 1)) {
      local_40[__n] = *(byte *)(lVar2 + __n) ^ local_38[__n];
      __n = __n + 1;
    }
    EVP_CIPHER_CTX_set_num(in_RDI,__n & 0xffffffff);
    if (bVar4) {
      memcpy((void *)(lVar2 + 0x10),local_40,__n);
    }
  }
  else {
    EVP_CIPHER_CTX_set_num(in_RDI,0);
  }
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_cfb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c =
        (gost_grasshopper_cipher_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    bool encrypting = (bool) EVP_CIPHER_CTX_encrypting(ctx);
    int num = EVP_CIPHER_CTX_num(ctx);
    size_t i = 0;
    size_t j = 0;

    /* process partial block if any */
    if (num > 0) {
        for (j = (size_t)num, i = 0; j < GRASSHOPPER_BLOCK_SIZE && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            if (!encrypting) {
                buf[j + GRASSHOPPER_BLOCK_SIZE] = *in_ptr;
            }
            *out_ptr = buf[j] ^ (*in_ptr);
            if (encrypting) {
                buf[j + GRASSHOPPER_BLOCK_SIZE] = *out_ptr;
            }
        }
        if (j == GRASSHOPPER_BLOCK_SIZE) {
            memcpy(iv, buf + GRASSHOPPER_BLOCK_SIZE, GRASSHOPPER_BLOCK_SIZE);
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, (int)j);
            return 1;
        }
    }

    for (; i + GRASSHOPPER_BLOCK_SIZE <
         inl;
         i += GRASSHOPPER_BLOCK_SIZE, in_ptr +=
         GRASSHOPPER_BLOCK_SIZE, out_ptr += GRASSHOPPER_BLOCK_SIZE) {
        /*
         * block cipher current iv
         */
        grasshopper_encrypt_block(&c->encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) buf, &c->buffer);
        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        if (!encrypting) {
            memcpy(iv, in_ptr, GRASSHOPPER_BLOCK_SIZE);
        }
        for (j = 0; j < GRASSHOPPER_BLOCK_SIZE; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        /* Encrypt */
        /* Next iv is next block of cipher text */
        if (encrypting) {
            memcpy(iv, out_ptr, GRASSHOPPER_BLOCK_SIZE);
        }
    }

    /* Process rest of buffer */
    if (i < inl) {
        grasshopper_encrypt_block(&c->encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) buf, &c->buffer);
        if (!encrypting) {
            memcpy(buf + GRASSHOPPER_BLOCK_SIZE, in_ptr, inl - i);
        }
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, (int)j);
        if (encrypting) {
            memcpy(buf + GRASSHOPPER_BLOCK_SIZE, out_ptr, j);
        }
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }

    return 1;
}